

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O0

Id __thiscall
anon_unknown.dwarf_b0093a::TGlslangToSpvTraverser::makeSmearedConstant
          (TGlslangToSpvTraverser *this,Id constant,int vectorSize)

{
  Id component;
  int local_44;
  undefined1 local_40 [4];
  int c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> components;
  Id vectorTypeId;
  int vectorSize_local;
  Id constant_local;
  TGlslangToSpvTraverser *this_local;
  
  this_local._4_4_ = constant;
  if (vectorSize != 0) {
    vectorTypeId = constant;
    _vectorSize_local = this;
    component = spv::Builder::getTypeId(&this->builder,constant);
    components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         spv::Builder::makeVectorType(&this->builder,component,vectorSize);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
    for (local_44 = 0; local_44 < vectorSize; local_44 = local_44 + 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,&vectorTypeId);
    }
    this_local._4_4_ =
         spv::Builder::makeCompositeConstant
                   (&this->builder,
                    components.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,false);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  }
  return this_local._4_4_;
}

Assistant:

spv::Id TGlslangToSpvTraverser::makeSmearedConstant(spv::Id constant, int vectorSize)
{
    if (vectorSize == 0)
        return constant;

    spv::Id vectorTypeId = builder.makeVectorType(builder.getTypeId(constant), vectorSize);
    std::vector<spv::Id> components;
    for (int c = 0; c < vectorSize; ++c)
        components.push_back(constant);
    return builder.makeCompositeConstant(vectorTypeId, components);
}